

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

void __thiscall procxx::process::exec(process *this)

{
  char *__file;
  bool bVar1;
  uint uVar2;
  pipe_end pVar3;
  exception *peVar4;
  pipe_t *ppVar5;
  size_type sVar6;
  reference ppcVar7;
  char **__argv;
  int *piVar8;
  long *plVar9;
  size_t in_RCX;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined4 local_cc;
  ssize_t sStack_c8;
  int ec;
  ssize_t bytes;
  uint local_b8;
  char err_1 [4];
  int local_9c;
  value_type pcStack_98;
  char err [4];
  value_type local_90;
  reference local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  vector<char_*,_std::allocator<char_*>_> args;
  __pid_t pid;
  pipe_t err_pipe;
  process *this_local;
  
  if (this->pid_ != -1) {
    peVar4 = (exception *)__cxa_allocate_exception(0x10);
    exception::runtime_error(peVar4,"process already started");
    __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
  }
  pipe_t::pipe_t((pipe_t *)&stack0xffffffffffffffdc);
  uVar2 = fork();
  if (uVar2 == 0xffffffff) {
    perror("fork()");
    peVar4 = (exception *)__cxa_allocate_exception(0x10);
    exception::runtime_error(peVar4,"Failed to fork child process");
    __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
  }
  if (uVar2 == 0) {
    pVar3 = pipe_t::read_end();
    pipe_t::close((pipe_t *)&stack0xffffffffffffffdc,pVar3.end_);
    ppVar5 = pipe_streambuf::stdin_pipe(&this->pipe_buf_);
    pVar3 = pipe_t::write_end();
    pipe_t::close(ppVar5,pVar3.end_);
    ppVar5 = pipe_ostreambuf::stdout_pipe(&(this->pipe_buf_).super_pipe_ostreambuf);
    pVar3 = pipe_t::read_end();
    pipe_t::close(ppVar5,pVar3.end_);
    ppVar5 = pipe_ostreambuf::stdout_pipe(&(this->pipe_buf_).super_pipe_ostreambuf);
    pVar3 = pipe_t::write_end();
    pipe_t::dup(ppVar5,pVar3.end_);
    ppVar5 = pipe_ostreambuf::stdout_pipe(&this->err_buf_);
    pVar3 = pipe_t::read_end();
    pipe_t::close(ppVar5,pVar3.end_);
    ppVar5 = pipe_ostreambuf::stdout_pipe(&this->err_buf_);
    pVar3 = pipe_t::write_end();
    pipe_t::dup(ppVar5,pVar3.end_);
    if (this->read_from_ == (process *)0x0) {
      ppVar5 = pipe_streambuf::stdin_pipe(&this->pipe_buf_);
      args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = pipe_t::read_end();
      pipe_t::dup(ppVar5,args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_);
    }
    else {
      recursive_close_stdin(this->read_from_);
      ppVar5 = pipe_streambuf::stdin_pipe(&this->pipe_buf_);
      pVar3 = pipe_t::read_end();
      pipe_t::close(ppVar5,pVar3.end_);
      ppVar5 = pipe_ostreambuf::stdout_pipe(&(this->read_from_->pipe_buf_).super_pipe_ostreambuf);
      pVar3 = pipe_t::read_end();
      pipe_t::dup(ppVar5,pVar3.end_);
    }
    std::vector<char_*,_std::allocator<char_*>_>::vector
              ((vector<char_*,_std::allocator<char_*>_> *)&__range4);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->args_);
    std::vector<char_*,_std::allocator<char_*>_>::reserve
              ((vector<char_*,_std::allocator<char_*>_> *)&__range4,sVar6 + 1);
    __end4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->args_);
    arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->args_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end4);
      local_90 = (value_type)std::__cxx11::string::c_str();
      std::vector<char_*,_std::allocator<char_*>_>::push_back
                ((vector<char_*,_std::allocator<char_*>_> *)&__range4,&local_90);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end4);
    }
    pcStack_98 = (value_type)0x0;
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              ((vector<char_*,_std::allocator<char_*>_> *)&__range4,&stack0xffffffffffffff68);
    limits_t::set_limits(&this->limits_);
    ppcVar7 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                        ((vector<char_*,_std::allocator<char_*>_> *)&__range4,0);
    __file = *ppcVar7;
    __argv = std::vector<char_*,_std::allocator<char_*>_>::data
                       ((vector<char_*,_std::allocator<char_*>_> *)&__range4);
    execvp(__file,__argv);
    piVar8 = __errno_location();
    local_9c = *piVar8;
    iVar10 = (int)&local_9c;
    pipe_t::write((pipe_t *)&stack0xffffffffffffffdc,iVar10,(void *)0x4,in_RCX);
    pipe_t::close((pipe_t *)&stack0xffffffffffffffdc,iVar10);
    _Exit(1);
  }
  pVar3 = pipe_t::write_end();
  pipe_t::close((pipe_t *)&stack0xffffffffffffffdc,pVar3.end_);
  ppVar5 = pipe_ostreambuf::stdout_pipe(&(this->pipe_buf_).super_pipe_ostreambuf);
  pVar3 = pipe_t::write_end();
  pipe_t::close(ppVar5,pVar3.end_);
  ppVar5 = pipe_ostreambuf::stdout_pipe(&this->err_buf_);
  pVar3 = pipe_t::write_end();
  pipe_t::close(ppVar5,pVar3.end_);
  ppVar5 = pipe_streambuf::stdin_pipe(&this->pipe_buf_);
  pVar3 = pipe_t::read_end();
  pipe_t::close(ppVar5,pVar3.end_);
  if (this->read_from_ != (process *)0x0) {
    ppVar5 = pipe_streambuf::stdin_pipe(&this->pipe_buf_);
    pVar3 = pipe_t::write_end();
    pipe_t::close(ppVar5,pVar3.end_);
    ppVar5 = pipe_ostreambuf::stdout_pipe(&(this->read_from_->pipe_buf_).super_pipe_ostreambuf);
    err_1 = (char  [4])pipe_t::read_end();
    pipe_t::close(ppVar5,(int)err_1);
    ppVar5 = pipe_ostreambuf::stdout_pipe(&this->read_from_->err_buf_);
    local_b8 = (uint)pipe_t::read_end();
    pipe_t::close(ppVar5,local_b8);
  }
  this->pid_ = uVar2;
  iVar10 = (int)&bytes + 4;
  sStack_c8 = pipe_t::read((pipe_t *)&stack0xffffffffffffffdc,iVar10,(void *)0x4,(ulong)uVar2);
  if (sStack_c8 == 4) {
    local_cc = bytes._4_4_;
    peVar4 = (exception *)__cxa_allocate_exception(0x10);
    plVar9 = (long *)std::_V2::system_category();
    (**(code **)(*plVar9 + 0x20))(&local_110,plVar9,local_cc);
    std::operator+(&local_f0,"Failed to exec process: ",&local_110);
    exception::runtime_error(peVar4,&local_f0);
    __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
  }
  pipe_t::close((pipe_t *)&stack0xffffffffffffffdc,iVar10);
  pipe_t::~pipe_t((pipe_t *)&stack0xffffffffffffffdc);
  return;
}

Assistant:

void exec() {
    if (pid_ != -1)
      throw exception{"process already started"};

    pipe_t err_pipe;

    auto pid = fork();
    if (pid == -1) {
      perror("fork()");
      throw exception{"Failed to fork child process"};
    } else if (pid == 0) {
      err_pipe.close(pipe_t::read_end());
      pipe_buf_.stdin_pipe().close(pipe_t::write_end());
      pipe_buf_.stdout_pipe().close(pipe_t::read_end());
      pipe_buf_.stdout_pipe().dup(pipe_t::write_end(), STDOUT_FILENO);
      err_buf_.stdout_pipe().close(pipe_t::read_end());
      err_buf_.stdout_pipe().dup(pipe_t::write_end(), STDERR_FILENO);

      if (read_from_) {
        read_from_->recursive_close_stdin();
        pipe_buf_.stdin_pipe().close(pipe_t::read_end());
        read_from_->pipe_buf_.stdout_pipe().dup(pipe_t::read_end(),
                                                STDIN_FILENO);
      } else {
        pipe_buf_.stdin_pipe().dup(pipe_t::read_end(), STDIN_FILENO);
      }

      std::vector<char*> args;
      args.reserve(args_.size() + 1);
      for (auto& arg : args_)
        args.push_back(const_cast<char*>(arg.c_str()));
      args.push_back(nullptr);

      limits_.set_limits();
      execvp(args[0], args.data());

      char err[sizeof(int)];
      std::memcpy(err, &errno, sizeof(int));
      err_pipe.write(err, sizeof(int));
      err_pipe.close();
      std::_Exit(EXIT_FAILURE);
    } else {
      err_pipe.close(pipe_t::write_end());
      pipe_buf_.stdout_pipe().close(pipe_t::write_end());
      err_buf_.stdout_pipe().close(pipe_t::write_end());
      pipe_buf_.stdin_pipe().close(pipe_t::read_end());
      if (read_from_) {
        pipe_buf_.stdin_pipe().close(pipe_t::write_end());
        read_from_->pipe_buf_.stdout_pipe().close(pipe_t::read_end());
        read_from_->err_buf_.stdout_pipe().close(pipe_t::read_end());
      }
      pid_ = pid;

      char err[sizeof(int)];
      auto bytes = err_pipe.read(err, sizeof(int));
      if (bytes == sizeof(int)) {
        int ec = 0;
        std::memcpy(&ec, err, sizeof(int));
        throw exception{"Failed to exec process: " +
                        std::system_category().message(ec)};
      } else {
        err_pipe.close();
      }
    }
  }